

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

Diagnostic * __thiscall slang::ast::Compilation::addDiag(Compilation *this,Diagnostic *diag)

{
  Scope **ppSVar1;
  bool bVar2;
  Symbol *pSVar3;
  Diagnostic *pDVar4;
  Symbol **ppSVar5;
  bool isNew;
  bool local_99;
  Diagnostic local_98;
  
  if (this->diagsDisabled == true) {
LAB_002afaa6:
    Diagnostic::operator=(&this->tempDiag,diag);
    return &this->tempDiag;
  }
  ppSVar5 = &diag->symbol;
  do {
    pSVar3 = *ppSVar5;
    do {
      if (pSVar3 == (Symbol *)0x0) {
LAB_002afae8:
        bVar2 = Diagnostic::isError(diag);
        Diagnostic::Diagnostic(&local_98,diag);
        pDVar4 = ASTDiagMap::add(&this->diagMap,&local_98,&local_99);
        Diagnostic::~Diagnostic(&local_98);
        if ((bVar2 & local_99) != 1) {
          return pDVar4;
        }
        this->numErrors = this->numErrors + 1;
        return pDVar4;
      }
      if (pSVar3->kind == GenerateBlock) {
        if (*(char *)((long)&pSVar3[1].originatingSyntax + 4) != '\x01') goto LAB_002afae8;
        goto LAB_002afaa6;
      }
      ppSVar1 = &pSVar3->parentScope;
      pSVar3 = (Symbol *)0x0;
    } while (*ppSVar1 == (Scope *)0x0);
    ppSVar5 = &(*ppSVar1)->thisSym;
  } while( true );
}

Assistant:

Diagnostic& Compilation::addDiag(Diagnostic diag) {
    SLANG_ASSERT(!isFrozen());

    if (diagsDisabled) {
        tempDiag = std::move(diag);
        return tempDiag;
    }

    auto isSuppressed = [](const Symbol* symbol) {
        while (symbol) {
            if (symbol->kind == SymbolKind::GenerateBlock)
                return symbol->as<GenerateBlockSymbol>().isUninstantiated;

            auto scope = symbol->getParentScope();
            symbol = scope ? &scope->asSymbol() : nullptr;
        }
        return false;
    };

    // Filter out diagnostics that came from inside an uninstantiated generate block.
    SLANG_ASSERT(diag.symbol);
    SLANG_ASSERT(diag.location);
    if (isSuppressed(diag.symbol)) {
        tempDiag = std::move(diag);
        return tempDiag;
    }

    const bool isError = diag.isError();

    bool isNew;
    auto& result = diagMap.add(std::move(diag), isNew);
    if (isNew && isError)
        numErrors++;

    return result;
}